

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O0

void __thiscall BamTools::RefData::RefData(RefData *this,RefData *param_2)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  return;
}

Assistant:

struct API_EXPORT RefData
{

    std::string RefName;  //!< name of reference sequence
    int32_t RefLength;    //!< length of reference sequence

    //! constructor
    RefData(const std::string& name = std::string(), const int32_t& length = 0)
        : RefName(name)
        , RefLength(length)
    {}
}